

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PinHole.cpp
# Opt level: O2

void __thiscall
pm::PinHole::renderScene
          (PinHole *this,World *world,Tracer *tracer,RGBColor *frame,int startX,int startY,
          int tileWidth,int tileHeight,bool progressive)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  float fVar6;
  undefined4 extraout_XMM0_Db;
  ulong in_XMM1_Qa;
  undefined4 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Vector3 VVar10;
  RGBColor local_98;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  float local_74;
  float local_70;
  float local_6c;
  _func_int **local_68;
  float local_60;
  Vector2 sp;
  Vector3 local_50;
  _func_int **local_44;
  float local_3c;
  RGBColor *local_38;
  
  local_84 = tileHeight;
  local_44 = (_func_int **)0x3f800000;
  local_3c = 0.0;
  local_50.x = (this->super_Camera).eye_.x;
  local_50.y = (this->super_Camera).eye_.y;
  local_50.z = (this->super_Camera).eye_.z;
  local_74 = (world->viewplane_).pixelSize_ / this->zoom_;
  local_88 = startX;
  local_38 = frame;
  if (progressive) {
    local_7c = 1;
  }
  else {
    local_7c = SamplerState::numSamples(&(world->viewplane_).samplerState_);
  }
  local_84 = local_84 + startY;
  iVar2 = tileWidth + local_88;
  if (local_7c < 1) {
    local_7c = 0;
  }
  iVar4 = local_7c;
  while (startY < local_84) {
    local_70 = (float)startY;
    local_78 = local_88;
    local_80 = startY;
    while (local_78 < iVar2) {
      local_98.r = 0.0;
      local_98.g = 0.0;
      local_98.b = 0.0;
      local_6c = (float)local_78;
      while( true ) {
        uVar7 = (undefined4)(in_XMM1_Qa >> 0x20);
        bVar5 = iVar4 == 0;
        iVar4 = iVar4 + -1;
        if (bVar5) break;
        SamplerState::sampleUnitSquare((SamplerState *)&sp);
        VVar10 = rayDirection((PinHole *)&local_68,
                              ((float)(world->viewplane_).width_ * -0.5 + local_6c + sp.x) *
                              local_74,((float)(world->viewplane_).height_ * -0.5 + local_70 + sp.y)
                                       * local_74);
        local_44 = local_68;
        local_3c = local_60;
        (*tracer->_vptr_Tracer[3])
                  (local_60,CONCAT44(uVar7,VVar10.z),(PinHole *)&local_68,tracer,world,&local_50,0);
        in_XMM1_Qa = CONCAT44(local_98.g + (float)((ulong)local_68 >> 0x20),
                              local_98.r + SUB84(local_68,0));
        local_98.b = local_60 + local_98.b;
        local_98._0_8_ = in_XMM1_Qa;
      }
      iVar3 = SamplerState::numSamples(&(world->viewplane_).samplerState_);
      iVar4 = local_78;
      fVar6 = (float)iVar3;
      fVar1 = (this->super_Camera).exposureTime_;
      auVar8._8_8_ = 0;
      auVar8._0_4_ = local_98.r;
      auVar8._4_4_ = local_98.g;
      auVar9._4_4_ = fVar6;
      auVar9._0_4_ = fVar6;
      auVar9._8_4_ = extraout_XMM0_Db;
      auVar9._12_4_ = extraout_XMM0_Db;
      auVar9 = divps(auVar8,auVar9);
      local_98.b = (local_98.b / fVar6) * fVar1;
      in_XMM1_Qa = 0;
      local_98.g = fVar1 * auVar9._4_4_;
      local_98.r = fVar1 * auVar9._0_4_;
      RGBColor::operator+=(local_38 + ((world->viewplane_).width_ * local_80 + local_78),&local_98);
      local_78 = iVar4 + 1;
      iVar4 = local_7c;
    }
    startY = local_80 + 1;
  }
  return;
}

Assistant:

void PinHole::renderScene(World &world, Tracer &tracer, RGBColor *frame, int startX, int startY, int tileWidth, int tileHeight, bool progressive)
{
	Ray ray;
	ray.o = eye_;
	const ViewPlane &vp = world.viewPlane();

	int depth = 0; // recursion depth
	const float pixelSize = vp.pixelSize() / zoom_;

	const int numSamples = progressive ? 1 : vp.samplerState().numSamples();
	for (int r = startY; r < startY + tileHeight; r++)
	{
		for (int c = startX; c < startX + tileWidth; c++)
		{
			RGBColor pixel(0.0f, 0.0f, 0.0f);
			for (int j = 0; j < numSamples; j++)
			{
				const Vector2 sp = vp.samplerState().sampleUnitSquare();
				const float x = pixelSize * (c - 0.5f * vp.width() + sp.x);
				const float y = pixelSize * (r - 0.5f * vp.height() + sp.y);
				ray.d = rayDirection(x, y);
				pixel += tracer.traceRay(world, ray, depth);
			}
			// Divide by number of samples even in progressive mode or the image gets too bright
			pixel /= static_cast<float>(vp.samplerState().numSamples());
			pixel *= exposureTime_;
			frame[r * vp.width() + c] += pixel;
		}
	}
}